

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O0

void util::rpn_map_multichar_op(string *str)

{
  bool bVar1;
  string *str_local;
  
  bVar1 = std::operator==(str,"==");
  if (bVar1) {
    std::__cxx11::string::operator=((string *)str,'=');
  }
  else {
    bVar1 = std::operator==(str,"!=");
    if (bVar1) {
      std::__cxx11::string::operator=((string *)str,'\x02');
    }
    else {
      bVar1 = std::operator==(str,"<=");
      if (bVar1) {
        std::__cxx11::string::operator=((string *)str,'\x03');
      }
      else {
        bVar1 = std::operator==(str,">=");
        if (bVar1) {
          std::__cxx11::string::operator=((string *)str,'\x04');
        }
        else {
          bVar1 = std::operator==(str,"&&");
          if (bVar1) {
            std::__cxx11::string::operator=((string *)str,'\x05');
          }
          else {
            bVar1 = std::operator==(str,"||");
            if (bVar1) {
              std::__cxx11::string::operator=((string *)str,'\x06');
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void rpn_map_multichar_op(std::string& str)
{
	if (str == "==")
		str = '=';
	else if (str == "!=")
		str = op_ne;
	else if (str == "<=")
		str = op_lte;
	else if (str == ">=")
		str = op_gte;
	else if (str == "&&")
		str = op_and;
	else if (str == "||")
		str = op_or;
}